

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.c
# Opt level: O1

void asm_append_u64(MCodeChunk *chunk,uint64_t arg)

{
  asm_append_u8(chunk,(uint8_t)arg);
  asm_append_u8(chunk,(uint8_t)(arg >> 8));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x10));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x18));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x20));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x28));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x30));
  asm_append_u8(chunk,(uint8_t)(arg >> 0x38));
  return;
}

Assistant:

void asm_append_u64(MCodeChunk *chunk, uint64_t arg) {
#if ARCH_ENDIAN == ENDIAN_LITTLE
	asm_append_u8(chunk, (uint8_t) arg);
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
	asm_append_u8(chunk, (uint8_t) (arg >> 16));
	asm_append_u8(chunk, (uint8_t) (arg >> 24));
	asm_append_u8(chunk, (uint8_t) (arg >> 32));
	asm_append_u8(chunk, (uint8_t) (arg >> 40));
	asm_append_u8(chunk, (uint8_t) (arg >> 48));
	asm_append_u8(chunk, (uint8_t) (arg >> 56));
#else
	asm_append_u8(chunk, (uint8_t) (arg >> 56));
	asm_append_u8(chunk, (uint8_t) (arg >> 48));
	asm_append_u8(chunk, (uint8_t) (arg >> 40));
	asm_append_u8(chunk, (uint8_t) (arg >> 32));
	asm_append_u8(chunk, (uint8_t) (arg >> 24));
	asm_append_u8(chunk, (uint8_t) (arg >> 16));
	asm_append_u8(chunk, (uint8_t) (arg >> 8));
	asm_append_u8(chunk, (uint8_t) arg);
#endif
}